

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000019c980 = 0x2e2e2e2e2e2e2e;
    uRam000000000019c987._0_1_ = '.';
    uRam000000000019c987._1_1_ = '.';
    uRam000000000019c987._2_1_ = '.';
    uRam000000000019c987._3_1_ = '.';
    uRam000000000019c987._4_1_ = '.';
    uRam000000000019c987._5_1_ = '.';
    uRam000000000019c987._6_1_ = '.';
    uRam000000000019c987._7_1_ = '.';
    DAT_0019c970 = '.';
    DAT_0019c970_1._0_1_ = '.';
    DAT_0019c970_1._1_1_ = '.';
    DAT_0019c970_1._2_1_ = '.';
    DAT_0019c970_1._3_1_ = '.';
    DAT_0019c970_1._4_1_ = '.';
    DAT_0019c970_1._5_1_ = '.';
    DAT_0019c970_1._6_1_ = '.';
    uRam000000000019c978 = 0x2e2e2e2e2e2e2e;
    DAT_0019c97f = 0x2e;
    DAT_0019c960 = '.';
    DAT_0019c960_1._0_1_ = '.';
    DAT_0019c960_1._1_1_ = '.';
    DAT_0019c960_1._2_1_ = '.';
    DAT_0019c960_1._3_1_ = '.';
    DAT_0019c960_1._4_1_ = '.';
    DAT_0019c960_1._5_1_ = '.';
    DAT_0019c960_1._6_1_ = '.';
    uRam000000000019c968._0_1_ = '.';
    uRam000000000019c968._1_1_ = '.';
    uRam000000000019c968._2_1_ = '.';
    uRam000000000019c968._3_1_ = '.';
    uRam000000000019c968._4_1_ = '.';
    uRam000000000019c968._5_1_ = '.';
    uRam000000000019c968._6_1_ = '.';
    uRam000000000019c968._7_1_ = '.';
    DAT_0019c950 = '.';
    DAT_0019c950_1._0_1_ = '.';
    DAT_0019c950_1._1_1_ = '.';
    DAT_0019c950_1._2_1_ = '.';
    DAT_0019c950_1._3_1_ = '.';
    DAT_0019c950_1._4_1_ = '.';
    DAT_0019c950_1._5_1_ = '.';
    DAT_0019c950_1._6_1_ = '.';
    uRam000000000019c958._0_1_ = '.';
    uRam000000000019c958._1_1_ = '.';
    uRam000000000019c958._2_1_ = '.';
    uRam000000000019c958._3_1_ = '.';
    uRam000000000019c958._4_1_ = '.';
    uRam000000000019c958._5_1_ = '.';
    uRam000000000019c958._6_1_ = '.';
    uRam000000000019c958._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000019c948._0_1_ = '.';
    uRam000000000019c948._1_1_ = '.';
    uRam000000000019c948._2_1_ = '.';
    uRam000000000019c948._3_1_ = '.';
    uRam000000000019c948._4_1_ = '.';
    uRam000000000019c948._5_1_ = '.';
    uRam000000000019c948._6_1_ = '.';
    uRam000000000019c948._7_1_ = '.';
    DAT_0019c98f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}